

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  char *pcVar1;
  uint uVar2;
  DTableDesc DVar3;
  BIT_DStream_status BVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  int bmi2_local;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  DTableDesc dtd;
  HUF_DEltX2 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *ostart;
  size_t err_;
  BIT_DStream_t bitD;
  size_t local_158;
  BYTE *pStart;
  char *local_128;
  size_t val;
  size_t val_2;
  size_t val_3;
  size_t val_1;
  size_t val_4;
  size_t val_5;
  size_t val_6;
  
  bitD.limitPtr = (char *)DTable;
  local_158 = BIT_initDStream((BIT_DStream_t *)&err_,cSrc,cSrcSize);
  uVar2 = ERR_isError(local_158);
  pcVar1 = bitD.limitPtr;
  if (uVar2 == 0) {
    pcVar6 = (char *)((long)dst + dstSize);
    DVar3 = HUF_getDTableDesc((HUF_DTable *)bitD.limitPtr);
    uVar2 = (uint)DVar3 >> 0x10 & 0xff;
    for (local_128 = (char *)dst; BVar4 = BIT_reloadDStream((BIT_DStream_t *)&err_),
        BVar4 == BIT_DStream_unfinished && local_128 < pcVar6 + -7;
        local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7]) {
      uVar5 = MEM_64bits();
      if (uVar5 != 0) {
        sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
        *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
        BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
        local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7];
      }
      MEM_64bits();
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
      *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
      BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
      local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7];
      uVar5 = MEM_64bits();
      if (uVar5 != 0) {
        sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
        *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
        BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
        local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7];
      }
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
      *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
      BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
    }
    for (; BVar4 = BIT_reloadDStream((BIT_DStream_t *)&err_),
        BVar4 == BIT_DStream_unfinished && local_128 <= pcVar6 + -2;
        local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7]) {
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
      *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
      BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
    }
    for (; local_128 <= pcVar6 + -2; local_128 = local_128 + (byte)pcVar1[sVar7 * 4 + 7]) {
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
      *(undefined2 *)local_128 = *(undefined2 *)(pcVar1 + sVar7 * 4 + 4);
      BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
    }
    if (local_128 < pcVar6) {
      sVar7 = BIT_lookBitsFast((BIT_DStream_t *)&err_,uVar2);
      *local_128 = pcVar1[sVar7 * 4 + 4];
      if (pcVar1[sVar7 * 4 + 7] == '\x01') {
        BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]);
      }
      else if (((uint)bitD.bitContainer < 0x40) &&
              (BIT_skipBits((BIT_DStream_t *)&err_,(uint)(byte)pcVar1[sVar7 * 4 + 6]),
              0x40 < (uint)bitD.bitContainer)) {
        bitD.bitContainer._0_4_ = 0x40;
      }
    }
    uVar2 = BIT_endOfDStream((BIT_DStream_t *)&err_);
    local_158 = dstSize;
    if (uVar2 == 0) {
      local_158 = 0xffffffffffffffec;
    }
  }
  return local_158;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}